

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

int __thiscall pbrt::Object::writeTo(Object *this,BinaryWriter *binary)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer psVar3;
  pointer psVar4;
  Object *pOVar5;
  size_t in_RCX;
  void *in_RDX;
  pointer psVar6;
  pointer psVar7;
  pointer psVar8;
  int32_t local_6c;
  SP local_68;
  SP local_58;
  SP local_48;
  Object *local_38;
  
  BinaryWriter::write(binary,(int)this + 0x60,in_RDX,in_RCX);
  local_6c = (int32_t)((ulong)((long)(this->shapes).
                                     super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->shapes).
                                    super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
  BinaryWriter::writeRaw(binary,&local_6c,4);
  psVar6 = (this->shapes).
           super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->shapes).
           super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  if (psVar6 != psVar1) {
    do {
      local_48.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &((psVar6->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_Entity;
      p_Var2 = (psVar6->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
      if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_48.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_48.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var2;
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
            goto LAB_00117e81;
          }
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
LAB_00117e81:
      local_6c = BinaryWriter::serialize(binary,&local_48);
      BinaryWriter::writeRaw(binary,&local_6c,4);
      if (local_48.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar1);
  }
  pOVar5 = local_38;
  local_6c = (int32_t)((ulong)((long)(local_38->lightSources).
                                     super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_38->lightSources).
                                    super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
  BinaryWriter::writeRaw(binary,&local_6c,4);
  psVar7 = (pOVar5->lightSources).
           super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (pOVar5->lightSources).
           super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar7 != psVar3) {
    do {
      local_58.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &((psVar7->super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_Entity;
      p_Var2 = (psVar7->super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_58.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_58.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var2;
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
            goto LAB_00117f63;
          }
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
LAB_00117f63:
      local_6c = BinaryWriter::serialize(binary,&local_58);
      BinaryWriter::writeRaw(binary,&local_6c,4);
      if (local_58.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      psVar7 = psVar7 + 1;
    } while (psVar7 != psVar3);
  }
  pOVar5 = local_38;
  local_6c = (int32_t)((ulong)((long)(local_38->instances).
                                     super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_38->instances).
                                    super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
  BinaryWriter::writeRaw(binary,&local_6c,4);
  psVar8 = (pOVar5->instances).
           super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (pOVar5->instances).
           super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar8 != psVar4) {
    do {
      local_68.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &((psVar8->super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_Entity;
      p_Var2 = (psVar8->super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
      if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_68.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_68.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var2;
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
            goto LAB_00118045;
          }
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
LAB_00118045:
      local_6c = BinaryWriter::serialize(binary,&local_68);
      BinaryWriter::writeRaw(binary,&local_6c,4);
      if (local_68.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar4);
  }
  return 2;
}

Assistant:

int Object::writeTo(BinaryWriter &binary) 
  {
    binary.write(name);
    binary.write((int32_t)shapes.size());
    for (auto geom : shapes) {
      binary.write(binary.serialize(geom));
    }
    binary.write((int32_t)lightSources.size());
    for (auto ls : lightSources) {
      binary.write(binary.serialize(ls));
    }
    binary.write((int32_t)instances.size());
    for (auto inst : instances) {
      binary.write(binary.serialize(inst));
    }
    return TYPE_OBJECT;
  }